

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demo.cpp
# Opt level: O0

void __thiscall CDemoRecorder::WriteTickMarker(CDemoRecorder *this,int Tick,int Keyframe)

{
  long lVar1;
  int in_EDX;
  uint in_ESI;
  void *in_RDI;
  long in_FS_OFFSET;
  uchar aChunk_1 [1];
  uchar aChunk [5];
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (((*(int *)((long)in_RDI + 0x4048) == -1) ||
      (0x3f < (int)(in_ESI - *(int *)((long)in_RDI + 0x4048)))) || (in_EDX != 0)) {
    int_to_bytes_be((uchar *)CONCAT44(in_ESI,in_EDX),(int)((ulong)in_RDI >> 0x20));
    io_write((IOHANDLE)CONCAT44(in_ESI,in_EDX),in_RDI,0);
  }
  else {
    io_write((IOHANDLE)((ulong)in_ESI << 0x20),in_RDI,0);
  }
  *(uint *)((long)in_RDI + 0x4048) = in_ESI;
  if (*(int *)((long)in_RDI + 0x4050) < 0) {
    *(uint *)((long)in_RDI + 0x4050) = in_ESI;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CDemoRecorder::WriteTickMarker(int Tick, int Keyframe)
{
	if(m_LastTickMarker == -1 || Tick-m_LastTickMarker > 63 || Keyframe)
	{
		unsigned char aChunk[5];
		aChunk[0] = CHUNKTYPEFLAG_TICKMARKER;
		int_to_bytes_be(aChunk+1, Tick);

		if(Keyframe)
			aChunk[0] |= CHUNKTICKFLAG_KEYFRAME;

		io_write(m_File, aChunk, sizeof(aChunk));
	}
	else
	{
		unsigned char aChunk[1];
		aChunk[0] = CHUNKTYPEFLAG_TICKMARKER | (Tick-m_LastTickMarker);
		io_write(m_File, aChunk, sizeof(aChunk));
	}

	m_LastTickMarker = Tick;
	if(m_FirstTick < 0)
		m_FirstTick = Tick;
}